

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asc2log.c
# Opt level: O0

void get_can_id(canid_t *can_id,char *idstring,int base)

{
  size_t sVar1;
  ulong uVar2;
  int in_EDX;
  char *in_RSI;
  uint *in_RDI;
  
  sVar1 = strlen(in_RSI);
  if (in_RSI[sVar1 - 1] == 'x') {
    *in_RDI = 0x80000000;
    sVar1 = strlen(in_RSI);
    in_RSI[sVar1 - 1] = '\0';
  }
  else {
    *in_RDI = 0;
  }
  uVar2 = strtoul(in_RSI,(char **)0x0,in_EDX);
  *in_RDI = *in_RDI | (uint)uVar2;
  return;
}

Assistant:

static void get_can_id(canid_t *can_id, char *idstring, int base)
{
	if (idstring[strlen(idstring)-1] == 'x') {
		*can_id = CAN_EFF_FLAG;
		idstring[strlen(idstring)-1] = 0;
	} else
		*can_id = 0;
    
	*can_id |= strtoul(idstring, NULL, base);
}